

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception-test.c++
# Opt level: O3

void __thiscall kj::_::anon_unknown_0::TestCase96::run(TestCase96 *this)

{
  ThrowingDestructor t_1;
  ThrowingDestructor t;
  DebugComparison<const_char_(&)[31],_kj::StringPtr> _kjCondition;
  Fault local_358 [101];
  
  UnwindDetector::UnwindDetector(&t.super_UnwindDetector);
  ThrowingDestructor::~ThrowingDestructor(&t);
  _kjCondition.right.content.ptr =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
  ;
  _kjCondition.right.content.size_._0_4_ = 0x69;
  _kjCondition.left._0_1_ = 1;
  Debug::log<char_const(&)[19],char_const(&)[19]>
            ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
             ,0x69,ERROR,"\"expectation failed\", info",(char (*) [19])"expectation failed",
             (char (*) [19])"Expected exception");
  AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&_kjCondition);
  UnwindDetector::UnwindDetector(&t_1.super_UnwindDetector);
  Debug::Fault::Fault<kj::Exception::Type,char_const(&)[4]>
            (local_358,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
             ,0x6f,FAILED,(char *)0x0,"\"baz\"",(char (*) [4])0x1deadb);
  Debug::Fault::~Fault(local_358);
  ThrowingDestructor::~ThrowingDestructor(&t_1);
  _kjCondition.right.content.ptr =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
  ;
  _kjCondition.right.content.size_._0_4_ = 0x77;
  _kjCondition.left._0_1_ = 1;
  Debug::log<char_const(&)[19],char_const(&)[19]>
            ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
             ,0x77,ERROR,"\"expectation failed\", info",(char (*) [19])"expectation failed",
             (char (*) [19])"Expected exception");
  AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&_kjCondition);
  return;
}

Assistant:

~ThrowingDestructor() noexcept(false) {
    catchExceptionsIfUnwinding([]() {
      KJ_FAIL_ASSERT("this is a test, not a real bug");
    });
  }